

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  BaseType BVar1;
  StorageClass SVar2;
  undefined1 *puVar3;
  uint uVar4;
  string *psVar5;
  bool bVar6;
  uint32_t uVar7;
  uint uVar8;
  GLSLstd450 GVar9;
  uint32_t uVar10;
  SPIRType *pSVar11;
  SPIRExpression *pSVar12;
  mapped_type *pmVar13;
  char *pcVar14;
  ulong uVar15;
  SPIRConstant *pSVar16;
  SPIRVariable *pSVar17;
  CompilerError *this_00;
  Variant *pVVar18;
  _Alloc_hider _Var19;
  char (*ts_2) [3];
  uint32_t op2;
  __node_gen_type __node_gen;
  BaseType input_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_d8;
  string local_b8;
  string local_98;
  uint32_t local_74;
  string local_70;
  string local_50;
  
  ts_2 = (char (*) [3])args;
  local_74 = id;
  uVar7 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  uVar4 = uVar7 - 8 >> 3;
  uVar8 = uVar7 << 0x1d | uVar4;
  if ((7 < uVar8) || ((0x8bU >> (uVar4 & 0x1f) & 1) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  input_type = *(BaseType *)(&DAT_002bb5a4 + (ulong)uVar8 * 4);
  BVar1 = *(BaseType *)(&DAT_002bb5c4 + (ulong)uVar8 * 4);
  GVar9 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  pSVar11 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + result_type);
  switch(GVar9) {
  case GLSLstd450RoundEven:
    uVar7 = *args;
    pcVar14 = "rint";
    break;
  default:
    goto switchD_0021cfc1_caseD_3;
  case GLSLstd450Sinh:
    if (pSVar11->basetype != Half) {
      uVar7 = *args;
      pcVar14 = "fast::sinh";
      break;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"half(fast::sinh(",(char (*) [17])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdd73,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_0021e10c;
  case GLSLstd450Cosh:
    if (pSVar11->basetype != Half) {
      uVar7 = *args;
      pcVar14 = "fast::cosh";
      break;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"half(fast::cosh(",(char (*) [17])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdd73,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_0021e10c;
  case GLSLstd450Tanh:
    if (pSVar11->basetype != Half) {
      uVar7 = *args;
      pcVar14 = "precise::tanh";
      break;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"half(fast::tanh(",(char (*) [17])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdd73,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_0021e10c;
  case GLSLstd450Atan2:
    if (pSVar11->basetype != Half) {
      uVar7 = *args;
      uVar10 = args[1];
      pcVar14 = "precise::atan2";
      goto LAB_0021df2e;
    }
    CompilerGLSL::to_unpacked_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_98,&this->super_CompilerGLSL,args[1],true);
    join<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"half(fast::atan2(",(char (*) [18])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d07c3,
               (char (*) [3])&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdd73,
               (char (*) [3])in_stack_fffffffffffffef8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar6) {
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar6 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,args[1]);
    goto LAB_0021e10c;
  case GLSLstd450Pow:
    uVar7 = *args;
    uVar10 = args[1];
    pcVar14 = "powr";
    goto LAB_0021df2e;
  case GLSLstd450InverseSqrt:
    uVar7 = *args;
    pcVar14 = "rsqrt";
    break;
  case GLSLstd450MatrixInverse:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = pSVar11->columns;
    if (uVar7 == 4) {
      uVar7 = *args;
      pcVar14 = "spvInverse4x4";
    }
    else if (uVar7 == 3) {
      uVar7 = *args;
      pcVar14 = "spvInverse3x3";
    }
    else {
      if (uVar7 != 2) {
        return;
      }
      uVar7 = *args;
      pcVar14 = "spvInverse2x2";
    }
    break;
  case GLSLstd450Modf:
  case GLSLstd450Frexp:
    uVar7 = args[1];
    uVar15 = (ulong)uVar7;
    if ((uVar15 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar18 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.ptr, pVVar18[uVar15].type == TypeExpression
       )) {
      pSVar12 = Variant::get<spirv_cross::SPIRExpression>(pVVar18 + uVar15);
      uVar7 = args[1];
    }
    else {
      pSVar12 = (SPIRExpression *)0x0;
    }
    pSVar11 = Compiler::expression_type((Compiler *)this,uVar7);
    SVar2 = pSVar11->storage;
    if (((SVar2 - StorageClassPrivate < 3) || (SVar2 == StorageClassInput)) ||
       ((SVar2 == StorageClassOutput && (this->capture_output_to_buffer == false)))) {
      if ((pSVar12 == (SPIRExpression *)0x0) || (pSVar12->access_chain != true)) goto LAB_0021da44;
      pSVar11 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar6 = Compiler::is_scalar((Compiler *)this,pSVar11);
      if (!bVar6) goto LAB_0021da44;
    }
    CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
    local_b8._M_dataplus._M_p =
         (pointer)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_b8._M_dataplus._M_p,&local_74);
    pmVar13 = ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&(this->super_CompilerGLSL).extra_sub_expressions,&local_74);
    if (*pmVar13 == 0) {
      uVar7 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *pmVar13 = uVar7;
    }
    uVar7 = Compiler::expression_type_id((Compiler *)this,args[1]);
    uVar7 = Compiler::get_pointee_type_id((Compiler *)this,uVar7);
    CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,uVar7,*pmVar13);
    pcVar14 = "frexp";
    if (eop == 0x23) {
      pcVar14 = "modf";
    }
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type,local_74,*args,*pmVar13,pcVar14);
    CompilerGLSL::to_expression_abi_cxx11_(&local_b8,&this->super_CompilerGLSL,args[1],true);
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*pmVar13,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_b8,(char (*) [4])0x2d3d47,&local_d8,
               (char (*) [2])0x2d3bdb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    goto LAB_0021e10c;
  case GLSLstd450FMin:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (pSVar11->basetype == Float) {
      pcVar14 = "fast::min";
      goto LAB_0021df2e;
    }
    goto LAB_0021d9e2;
  case GLSLstd450FMax:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (pSVar11->basetype == Float) {
      pcVar14 = "fast::max";
      goto LAB_0021df2e;
    }
    goto LAB_0021d855;
  case GLSLstd450FClamp:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    op2 = args[2];
    if (pSVar11->basetype == Float) {
      pcVar14 = "fast::clamp";
      goto LAB_0021da17;
    }
    goto LAB_0021d80c;
  case GLSLstd450PackSnorm4x8:
    uVar7 = *args;
    pcVar14 = "pack_float_to_snorm4x8";
    break;
  case GLSLstd450PackUnorm4x8:
    uVar7 = *args;
    pcVar14 = "pack_float_to_unorm4x8";
    break;
  case GLSLstd450PackSnorm2x16:
    uVar7 = *args;
    pcVar14 = "pack_float_to_snorm2x16";
    break;
  case GLSLstd450PackUnorm2x16:
    uVar7 = *args;
    pcVar14 = "pack_float_to_unorm2x16";
    break;
  case GLSLstd450PackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"as_type<uint>(half2(",(char (*) [21])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdd73,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_0021e10c;
  case GLSLstd450PackDouble2x32:
    uVar7 = *args;
    pcVar14 = "unsupported_GLSLstd450PackDouble2x32";
    break;
  case GLSLstd450UnpackSnorm2x16:
    uVar7 = *args;
    pcVar14 = "unpack_snorm2x16_to_float";
    break;
  case GLSLstd450UnpackUnorm2x16:
    uVar7 = *args;
    pcVar14 = "unpack_unorm2x16_to_float";
    break;
  case GLSLstd450UnpackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (&local_b8,(spirv_cross *)"float2(as_type<half2>(",(char (*) [23])&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdd73,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
LAB_0021e10c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_0021e11a:
      operator_delete(local_b8._M_dataplus._M_p);
    }
    return;
  case GLSLstd450UnpackSnorm4x8:
    uVar7 = *args;
    pcVar14 = "unpack_snorm4x8_to_float";
    break;
  case GLSLstd450UnpackUnorm4x8:
    uVar7 = *args;
    pcVar14 = "unpack_unorm4x8_to_float";
    break;
  case GLSLstd450UnpackDouble2x32:
    uVar7 = *args;
    pcVar14 = "unsupported_GLSLstd450UnpackDouble2x32";
    break;
  case GLSLstd450Length:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar11->vecsize != 1) goto LAB_0021da44;
    uVar7 = *args;
    pcVar14 = "abs";
    break;
  case GLSLstd450Distance:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar11->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_d8,&this->super_CompilerGLSL,*args,true);
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_98,&this->super_CompilerGLSL,args[1],true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&local_b8,(spirv_cross *)"abs(",(char (*) [5])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bf7b7,
                 (char (*) [4])&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1,
                 (char (*) [2])in_stack_fffffffffffffef8);
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      if (bVar6) {
        bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      else {
        bVar6 = false;
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b8,bVar6,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,args[1]);
      return;
    }
    goto LAB_0021da44;
  case GLSLstd450Normalize:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar11->vecsize == 1) {
      uVar7 = *args;
      pcVar14 = "sign";
    }
    else {
      uVar7 = *args;
      if ((pSVar11->vecsize < 4) && (pSVar11->basetype == Half)) {
        pcVar14 = "normalize";
      }
      else {
        pcVar14 = "fast::normalize";
      }
    }
    break;
  case GLSLstd450FaceForward:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar11->vecsize == 1) {
      uVar7 = *args;
      uVar10 = args[1];
      op2 = args[2];
      pcVar14 = "spvFaceForward";
      goto LAB_0021da17;
    }
    goto switchD_0021cfc1_caseD_3;
  case GLSLstd450Reflect:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar11->vecsize == 1) {
      uVar7 = *args;
      uVar10 = args[1];
      pcVar14 = "spvReflect";
      goto LAB_0021df2e;
    }
    goto switchD_0021cfc1_caseD_3;
  case GLSLstd450Refract:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar11->vecsize == 1) {
      uVar7 = *args;
      uVar10 = args[1];
      op2 = args[2];
      pcVar14 = "spvRefract";
      goto LAB_0021da17;
    }
switchD_0021cfc1_caseD_3:
LAB_0021da44:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  case GLSLstd450FindILsb:
    pSVar11 = Compiler::expression_type((Compiler *)this,*args);
    input_type = pSVar11->basetype;
    uVar7 = *args;
    pcVar14 = "spvFindLSB";
    goto LAB_0021d6d8;
  case GLSLstd450FindSMsb:
    uVar7 = *args;
    pcVar14 = "spvFindSMSB";
    goto LAB_0021d6d8;
  case GLSLstd450FindUMsb:
    uVar7 = *args;
    pcVar14 = "spvFindUMSB";
    input_type = BVar1;
LAB_0021d6d8:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar7,pcVar14,input_type,input_type);
    return;
  case GLSLstd450InterpolateAtCentroid:
    uVar7 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    bVar6 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar6) {
      uVar10 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar15 = (ulong)uVar10;
      if (((uVar15 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
          (pVVar18 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr,
          pVVar18[uVar15].type == TypeConstant)) &&
         (pSVar16 = Variant::get<spirv_cross::SPIRConstant>(pVVar18 + uVar15),
         pSVar16->specialization != true)) {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar16->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x2ba3f5,(char (*) [2])&local_98,(char **)pVVar18);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        psVar5 = &local_d8;
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar10,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x2be9ba,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be8bf,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar5 = &local_98;
        local_d8._M_dataplus._M_p = local_98._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &psVar5->field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar17 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar17);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar11,uVar7);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[27],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba3f5,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_centroid()",(char (*) [27])&local_b8,in_stack_fffffffffffffef8);
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar6,false);
    psVar5 = &local_d8;
    goto LAB_0021dfcd;
  case GLSLstd450InterpolateAtSample:
    uVar7 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    bVar6 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar6) {
      uVar10 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar15 = (ulong)uVar10;
      if (((uVar15 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
          (pVVar18 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr,
          pVVar18[uVar15].type == TypeConstant)) &&
         (pSVar16 = Variant::get<spirv_cross::SPIRConstant>(pVVar18 + uVar15),
         pSVar16->specialization != true)) {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar16->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x2ba3f5,(char (*) [2])&local_98,(char **)pVVar18);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        psVar5 = &local_d8;
        _Var19._M_p = local_d8._M_dataplus._M_p;
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar10,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x2be9ba,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be8bf,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar5 = &local_98;
        _Var19._M_p = local_98._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var19._M_p != &psVar5->field_2) {
        operator_delete(_Var19._M_p);
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar17 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar17);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar11,uVar7);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba3f5,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_sample(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba7f1,
               (char (*) [2])&local_b8,in_stack_ffffffffffffff08);
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar6) {
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar6 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar6,false);
    goto LAB_0021dfb2;
  case GLSLstd450InterpolateAtOffset:
    uVar7 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    bVar6 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar6) {
      uVar10 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar15 = (ulong)uVar10;
      if (((uVar15 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
          (pVVar18 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr,
          pVVar18[uVar15].type == TypeConstant)) &&
         (pSVar16 = Variant::get<spirv_cross::SPIRConstant>(pVVar18 + uVar15),
         pSVar16->specialization != true)) {
        local_98._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar16->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d8,(spirv_cross *)0x2ba3f5,(char (*) [2])&local_98,(char **)pVVar18);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        psVar5 = &local_d8;
        _Var19._M_p = local_d8._M_dataplus._M_p;
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar10,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)0x2be9ba,(char (*) [2])&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be8bf,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar5 = &local_98;
        _Var19._M_p = local_98._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var19._M_p != &psVar5->field_2) {
        operator_delete(_Var19._M_p);
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar17 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar17);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar11,uVar7);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[11],std::__cxx11::string&>
              (&local_d8,(spirv_cross *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ba3f5,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_offset(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + 0.4375)",
               (char (*) [11])&local_b8,in_stack_ffffffffffffff08);
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar6) {
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar6 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d8,bVar6,false);
LAB_0021dfb2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    psVar5 = &local_50;
LAB_0021dfcd:
    puVar3 = *(undefined1 **)((psVar5->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &psVar5->field_2) {
      operator_delete(puVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      return;
    }
    goto LAB_0021e11a;
  case GLSLstd450NMin:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (pSVar11->basetype == Float) {
      pcVar14 = "precise::min";
      goto LAB_0021df2e;
    }
LAB_0021d9e2:
    pcVar14 = "min";
LAB_0021df2e:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar7,uVar10,pcVar14)
    ;
    return;
  case GLSLstd450NMax:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (pSVar11->basetype == Float) {
      pcVar14 = "precise::max";
      goto LAB_0021df2e;
    }
LAB_0021d855:
    pcVar14 = "max";
    goto LAB_0021df2e;
  case GLSLstd450NClamp:
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    op2 = args[2];
    if (pSVar11->basetype == Float) {
      pcVar14 = "precise::clamp";
      goto LAB_0021da17;
    }
LAB_0021d80c:
    pcVar14 = "clamp";
LAB_0021da17:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar7,uVar10,op2,pcVar14);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar7,pcVar14);
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	auto &restype = get<SPIRType>(result_type);

	switch (op)
	{
	case GLSLstd450Sinh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::sinh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::sinh");
		break;
	case GLSLstd450Cosh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::cosh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::cosh");
		break;
	case GLSLstd450Tanh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::tanh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "precise::tanh");
		break;
	case GLSLstd450Atan2:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::atan2(", to_unpacked_expression(args[0]), ", ", to_unpacked_expression(args[1]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

	case GLSLstd450InterpolateAtCentroid:
	{
		// We can't just emit the expression normally, because the qualified name contains a call to the default
		// interpolate method, or refers to a local variable. We saved the interface index we need; use it to construct
		// the base for the method call.
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_centroid()", component),
		        should_forward(args[0]));
		break;
	}

	case GLSLstd450InterpolateAtSample:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_sample(", to_expression(args[1]), ")", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450InterpolateAtOffset:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		// Like Direct3D, Metal puts the (0, 0) at the upper-left corner, not the center as SPIR-V and GLSL do.
		// Offset the offset by (1/2 - 1/16), or 0.4375, to compensate for this.
		// It has to be (1/2 - 1/16) and not 1/2, or several CTS tests subtly break on Intel.
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_offset(", to_expression(args[1]), " + 0.4375)", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions, so use abs().
		if (expression_type(args[0]).vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "abs");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
	{
		auto &exp_type = expression_type(args[0]);
		// MSL does not support scalar versions here.
		// MSL has no implementation for normalize in the fast:: namespace for half2 and half3
		// Returns -1 or 1 for valid input, sign() does the job.
		if (exp_type.vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "sign");
		else if (exp_type.vecsize <= 3 && exp_type.basetype == SPIRType::Half)
			emit_unary_func_op(result_type, id, args[0], "normalize");
		else
			emit_unary_func_op(result_type, id, args[0], "fast::normalize");
		break;
	}
	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		// Another special case is if the variable is in a storage class which is not thread.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		auto &type = expression_type(args[1]);

		bool is_thread_storage = storage_class_array_is_thread(type.storage);
		if (type.storage == StorageClassOutput && capture_output_to_buffer)
			is_thread_storage = false;

		if (!is_thread_storage ||
		    (ptr && ptr->access_chain && is_scalar(expression_type(args[1]))))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(expression_type_id(args[1]));
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	case GLSLstd450Pow:
		// powr makes x < 0.0 undefined, just like SPIR-V.
		emit_binary_func_op(result_type, id, args[0], args[1], "powr");
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}